

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::set_typical_values(PeleLM *this,bool is_restart)

{
  string *spName;
  Amr *pAVar1;
  pointer pdVar2;
  bool bVar3;
  int lev;
  int iVar4;
  pointer pdVar5;
  double *pdVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  PeleLM *pPVar8;
  ostream *poVar9;
  Print *pPVar10;
  int i;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  PeleLM *pPVar14;
  long lVar15;
  int i_1;
  long lVar16;
  double dVar17;
  Real RVar18;
  double dVar19;
  string tvfile;
  Vector<double,_std::allocator<double>_> velMaxV;
  FArrayBox tvfab;
  ifstream tvis;
  ostream local_228 [16];
  int aiStack_218 [122];
  
  pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pPVar8 = (PeleLM *)&tvfile;
  if ((this->super_NavierStokesBase).super_AmrLevel.level == 0) {
    if (is_restart) {
      uVar11 = (ulong)((long)typical_values.super_vector<double,_std::allocator<double>_>.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)typical_values.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3;
      uVar12 = 0;
      uVar13 = uVar11 & 0xffffffff;
      if ((int)uVar11 < 1) {
        uVar13 = uVar12;
      }
      for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
        pdVar5[uVar12] = -1.0;
      }
      pPVar14 = (PeleLM *)
                typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      if (*(int *)(amrex::ParallelContext::frames + 0xc) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tvis,
                       &((this->super_NavierStokesBase).super_AmrLevel.parent)->restart_chkfile,"/")
        ;
        std::operator+(&tvfile,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &tvis,&typical_values_filename_abi_cxx11_);
        std::__cxx11::string::~string((string *)&tvis);
        std::ifstream::ifstream(&tvis);
        std::ifstream::open((char *)&tvis,(_Ios_Openmode)tvfile._M_dataplus._M_p);
        if (*(int *)((long)aiStack_218 + *(long *)(_tvis + -0x18)) == 0) {
          amrex::FArrayBox::FArrayBox(&tvfab);
          amrex::FArrayBox::readFrom(&tvfab,(istream *)&tvis);
          if ((long)typical_values.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)typical_values.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3 != (long)tvfab.super_BaseFab<double>.nvar)
          {
            amrex::Abort_host("Typical values file has wrong number of components");
          }
          pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar15 = 0;
              lVar15 < (long)typical_values.super_vector<double,_std::allocator<double>_>.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
              lVar15 = lVar15 + 1) {
            pdVar6 = amrex::BaseFab<double>::dataPtr(&tvfab.super_BaseFab<double>,0);
            pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            typical_values.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar15] = pdVar6[lVar15];
          }
          amrex::BaseFab<double>::~BaseFab(&tvfab.super_BaseFab<double>);
        }
        std::ifstream::~ifstream(&tvis);
        std::__cxx11::string::~string((string *)&tvfile);
        this = pPVar8;
        pPVar14 = (PeleLM *)
                  typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
      }
    }
    else {
      std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
                ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&tvis,
                 (long)*(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c + 1,
                 (allocator_type *)&tvfab);
      for (lVar15 = 0; pAVar1 = (this->super_NavierStokesBase).super_AmrLevel.parent,
          lVar15 <= *(int *)&(pAVar1->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
          lVar15 = lVar15 + 1) {
        *(undefined8 *)(_tvis + lVar15 * 8) =
             *(undefined8 *)
              (*(long *)((long)(pAVar1->amr_level).
                               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        + 0x170) + 200);
      }
      amrex::VectorMax((Vector<double,_std::allocator<double>_> *)&tvfab,
                       (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                       &tvis,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                       NavierStokesBase::NUM_STATE + -3,0);
      amrex::VectorMin((Vector<double,_std::allocator<double>_> *)&tvfile,
                       (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                       &tvis,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                       NavierStokesBase::NUM_STATE + -3,0);
      amrex::VectorMaxAbs(&velMaxV,(Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                                    *)&tvis,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,0,3,0)
      ;
      _Var7 = std::
              __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (velMaxV.super_vector<double,_std::allocator<double>_>.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         velMaxV.super_vector<double,_std::allocator<double>_>.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar17 = *_Var7._M_current;
      iVar4 = 3;
      if (3 < NavierStokesBase::NUM_STATE) {
        iVar4 = NavierStokesBase::NUM_STATE;
      }
      for (uVar13 = 0;
          pdVar2 = typical_values.super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start, iVar4 - 3 != uVar13; uVar13 = uVar13 + 1) {
        dVar19 = (double)tvfab.super_BaseFab<double>._vptr_BaseFab[uVar13] -
                 *(double *)(tvfile._M_dataplus._M_p + uVar13 * 8);
        pdVar5[uVar13 + 3] = ABS(dVar19);
        if ((dVar19 == 0.0) && (!NAN(dVar19))) {
          pdVar5[uVar13 + 3] =
               ABS((double)tvfab.super_BaseFab<double>._vptr_BaseFab[uVar13] +
                   *(double *)(tvfile._M_dataplus._M_p + uVar13 * 8)) * 0.5;
        }
      }
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        pdVar2[lVar15] = dVar17;
      }
      dVar17 = typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[3];
      if (dVar17 <= 0.0) {
        amrex::Assert_host("typical_values[Density] > 0",
                           "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                           ,0x5a4,(char *)0x0);
        dVar17 = typical_values.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[3];
      }
      pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      typical_values.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [RhoH] = typical_values.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[RhoH] / dVar17;
      iVar4 = first_spec;
      for (lVar15 = 0; lVar15 != 9; lVar15 = lVar15 + 1) {
        RVar18 = typical_Y_val_min;
        if (typical_Y_val_min <= pdVar5[iVar4 + lVar15] / pdVar5[3]) {
          RVar18 = pdVar5[iVar4 + lVar15] / pdVar5[3];
        }
        pdVar5[iVar4 + lVar15] = RVar18;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&velMaxV);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&tvfile);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&tvfab);
      this = (PeleLM *)&tvis;
      std::_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
      ~_Vector_base((_Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                     *)this);
      pPVar14 = (PeleLM *)
                typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
    }
    while (pPVar14 !=
           (PeleLM *)&typical_values_FileVals_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      spName = (string *)
               ((pPVar14->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.offset + 1);
      iVar4 = getSpeciesIdx(spName);
      if (iVar4 < 0) {
        bVar3 = std::operator==(spName,"Temp");
        iVar4 = NavierStokesBase::Temp;
        if ((bVar3) || (bVar3 = std::operator==(spName,"RhoH"), iVar4 = RhoH, bVar3))
        goto LAB_00182344;
        bVar3 = std::operator==(spName,"Vel");
        pdVar5 = typical_values.super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        if (bVar3) {
          for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
            dVar17 = (pPVar14->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[2];
            RVar18 = typical_Y_val_min;
            if (typical_Y_val_min <= dVar17) {
              RVar18 = dVar17;
            }
            pdVar5[lVar15] = RVar18;
          }
        }
      }
      else {
        iVar4 = iVar4 + first_spec;
LAB_00182344:
        typical_values.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        [iVar4] = (pPVar14->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.dx[2];
      }
      pPVar8 = (PeleLM *)std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar14);
      this = pPVar14;
      pPVar14 = pPVar8;
    }
    update_typical_values_chem(this);
    if (NavierStokesBase::verbose != 0) {
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)&tvis,poVar9);
      std::operator<<(local_228,"Typical vals: ");
      std::operator<<(local_228,'\n');
      amrex::Print::~Print((Print *)&tvis);
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)&tvis,poVar9);
      std::operator<<(local_228,"\tVelocity: ");
      amrex::Print::~Print((Print *)&tvis);
      for (lVar15 = 0; lVar15 != 0x18; lVar15 = lVar15 + 8) {
        poVar9 = amrex::OutStream();
        amrex::Print::Print((Print *)&tvis,poVar9);
        pPVar10 = amrex::Print::operator<<
                            ((Print *)&tvis,
                             (double *)
                             ((long)typical_values.super_vector<double,_std::allocator<double>_>.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar15));
        std::operator<<((ostream *)&pPVar10->ss,' ');
        amrex::Print::~Print((Print *)&tvis);
      }
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)&tvis,poVar9);
      std::operator<<(local_228,'\n');
      amrex::Print::~Print((Print *)&tvis);
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)&tvis,poVar9);
      std::operator<<(local_228,"\tDensity: ");
      pPVar10 = amrex::Print::operator<<
                          ((Print *)&tvis,
                           typical_values.super_vector<double,_std::allocator<double>_>.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + 3);
      std::operator<<((ostream *)&pPVar10->ss,'\n');
      amrex::Print::~Print((Print *)&tvis);
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)&tvis,poVar9);
      std::operator<<(local_228,"\tTemp:    ");
      pPVar10 = amrex::Print::operator<<
                          ((Print *)&tvis,
                           typical_values.super_vector<double,_std::allocator<double>_>.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + NavierStokesBase::Temp);
      std::operator<<((ostream *)&pPVar10->ss,'\n');
      amrex::Print::~Print((Print *)&tvis);
      poVar9 = amrex::OutStream();
      amrex::Print::Print((Print *)&tvis,poVar9);
      std::operator<<(local_228,"\tRhoH:    ");
      pPVar10 = amrex::Print::operator<<
                          ((Print *)&tvis,
                           typical_values.super_vector<double,_std::allocator<double>_>.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + RhoH);
      std::operator<<((ostream *)&pPVar10->ss,'\n');
      amrex::Print::~Print((Print *)&tvis);
      lVar15 = 0;
      for (lVar16 = 0; lVar16 != 9; lVar16 = lVar16 + 1) {
        poVar9 = amrex::OutStream();
        amrex::Print::Print((Print *)&tvis,poVar9);
        std::operator<<(local_228,"\tY_");
        std::operator<<(local_228,
                        (string *)
                        ((long)&((spec_names_abi_cxx11_.
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar15));
        std::operator<<(local_228,": ");
        pPVar10 = amrex::Print::operator<<
                            ((Print *)&tvis,
                             typical_values.super_vector<double,_std::allocator<double>_>.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + first_spec + lVar16);
        std::operator<<((ostream *)&pPVar10->ss,'\n');
        amrex::Print::~Print((Print *)&tvis);
        lVar15 = lVar15 + 0x20;
      }
    }
  }
  return;
}

Assistant:

void
PeleLM::set_typical_values(bool is_restart)
{
  if (level==0)
  {
    const int nComp = typical_values.size();

    if (is_restart)
    {
      AMREX_ASSERT(nComp==NUM_STATE);

      for (int i=0; i<nComp; ++i)
        typical_values[i] = -1;

      if (ParallelDescriptor::IOProcessor())
      {
        const std::string tvfile = parent->theRestartFile() + "/" + typical_values_filename;
        std::ifstream tvis;
        tvis.open(tvfile.c_str(),std::ios::in|std::ios::binary);

        if (tvis.good())
        {
          FArrayBox tvfab;
          tvfab.readFrom(tvis);
          if (tvfab.nComp() != typical_values.size())
            amrex::Abort("Typical values file has wrong number of components");
          for (int i=0; i<typical_values.size(); ++i)
            typical_values[i] = tvfab.dataPtr()[i];
        }
      }

      ParallelDescriptor::ReduceRealMax(typical_values.dataPtr(),nComp); //FIXME: better way?
    }
    else
    {
      Vector<const MultiFab*> Slevs(parent->finestLevel()+1);

      for (int lev = 0; lev <= parent->finestLevel(); lev++)
      {
        Slevs[lev] = &(getLevel(lev).get_new_data(State_Type));
      }

      auto scaleMax = VectorMax(Slevs,FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto scaleMin = VectorMin(Slevs,FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto velMaxV = VectorMaxAbs(Slevs,FabArrayBase::mfiter_tile_size,0,AMREX_SPACEDIM,0);

      auto velMax = *max_element(std::begin(velMaxV), std::end(velMaxV));

      for (int i=0; i<NUM_STATE - AMREX_SPACEDIM; ++i) {
        typical_values[i + AMREX_SPACEDIM] = std::abs(scaleMax[i] - scaleMin[i]);
          if ( typical_values[i + AMREX_SPACEDIM] <= 0.0)
              typical_values[i + AMREX_SPACEDIM] = 0.5*std::abs(scaleMax[i] + scaleMin[i]);
      }

      for (int i=0; i<AMREX_SPACEDIM; ++i) {
        typical_values[i] = velMax;
      }

      AMREX_ALWAYS_ASSERT(typical_values[Density] > 0);
      typical_values[RhoH] = typical_values[RhoH] / typical_values[Density];
      for (int i=0; i<NUM_SPECIES; ++i) {
        typical_values[first_spec + i] = std::max(typical_values[first_spec + i]/typical_values[Density],
                                                  typical_Y_val_min);
      }
    }
    //
    // If typVals specified in inputs, these take precedence componentwise.
    //
    for (std::map<std::string,Real>::const_iterator it=typical_values_FileVals.begin(),
           End=typical_values_FileVals.end();
         it!=End;
         ++it)
    {
      const int idx = getSpeciesIdx(it->first);
      if (idx>=0)
      {
        typical_values[first_spec+idx] = it->second;
      }
      else
      {
        if (it->first == "Temp")
          typical_values[Temp] = it->second;
        else if (it->first == "RhoH")
          typical_values[RhoH] = it->second;
        else if (it->first == "Vel")
        {
          for (int d=0; d<AMREX_SPACEDIM; ++d)
            typical_values[d] = std::max(it->second,typical_Y_val_min);
        }
      }
    }
    update_typical_values_chem();
    if (verbose) {
       amrex::Print() << "Typical vals: " << '\n';
       amrex::Print() << "\tVelocity: ";
       for (int i=0; i<AMREX_SPACEDIM; ++i) {
         amrex::Print() << typical_values[i] << ' ';
       }
       amrex::Print() << '\n';
       amrex::Print() << "\tDensity: " << typical_values[Density] << '\n';
       amrex::Print() << "\tTemp:    " << typical_values[Temp]    << '\n';
       amrex::Print() << "\tRhoH:    " << typical_values[RhoH]    << '\n';
       for (int i=0; i<NUM_SPECIES; ++i)
       {
           amrex::Print() << "\tY_" << spec_names[i] << ": " << typical_values[first_spec+i] <<'\n';
       }
    }
  }
}